

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

char * __thiscall
Corrade::Utility::String::Implementation::anon_unknown_12::anon_func::anon_class_1_0_00000001::
operator()(anon_class_1_0_00000001 *this,char *a,char *b,size_t sizeA,size_t sizeB)

{
  anon_class_1_0_00000001 *paVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  anon_class_1_0_00000001 *paVar11;
  ostream *poVar12;
  long lVar13;
  long lVar14;
  anon_class_1_0_00000001 *paVar15;
  Error local_30;
  
  pcVar10 = b;
  if (sizeA < b) {
    pcVar10 = (char *)sizeA;
  }
  if (pcVar10 < (char *)0x20) {
    pcVar10 = __invoke((char *)this,a,(size_t)b,sizeA);
    return pcVar10;
  }
  auVar3 = vpcmpeqb_avx2(*(undefined1 (*) [32])this,*(undefined1 (*) [32])a);
  uVar9 = (uint)(SUB321(auVar3 >> 7,0) & 1) | (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
          (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
          (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
          (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
          (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
          (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb |
          (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc | (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd
          | (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
          (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
          (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
          (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
          (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
          (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
          (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
          (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
          (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 | (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19
          | (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
          (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
          (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
          (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
          (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f;
  if (uVar9 == 0xffffffff) {
    paVar11 = (anon_class_1_0_00000001 *)((ulong)(this + 0x20) & 0xffffffffffffffe0);
    lVar14 = (long)paVar11 - (long)this;
    if ((paVar11 < this || lVar14 == 0) || (lVar14 < 1)) {
      poVar12 = Error::defaultOutput();
      Error::Error(&local_30,poVar12,(Flags)0x0);
      Debug::operator<<(&local_30.super_Debug,
                        "Assertion i > a && j > b && reinterpret_cast<std::uintptr_t>(i) % 32 == 0 failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:385"
                       );
LAB_0013c2ce:
      Error::~Error(&local_30);
      abort();
    }
    paVar15 = this + (long)pcVar10;
    for (lVar13 = 0; paVar11 + lVar13 + 0x80 <= paVar15; lVar13 = lVar13 + 0x80) {
      auVar4 = vpcmpeqb_avx2(*(undefined1 (*) [32])(a + lVar13 + lVar14),
                             *(undefined1 (*) [32])(paVar11 + lVar13));
      auVar5 = vpcmpeqb_avx2(*(undefined1 (*) [32])(a + lVar13 + lVar14 + 0x20),
                             *(undefined1 (*) [32])(paVar11 + lVar13 + 0x20));
      auVar6 = vpcmpeqb_avx2(*(undefined1 (*) [32])(a + lVar13 + lVar14 + 0x40),
                             *(undefined1 (*) [32])(paVar11 + lVar13 + 0x40));
      auVar7 = vpcmpeqb_avx2(*(undefined1 (*) [32])(a + lVar13 + lVar14 + 0x60),
                             *(undefined1 (*) [32])(paVar11 + lVar13 + 0x60));
      auVar3 = vpand_avx2(auVar5,auVar4);
      auVar2 = vpand_avx2(auVar6,auVar7);
      auVar3 = vpand_avx2(auVar3,auVar2);
      if (((uint)(SUB321(auVar3 >> 7,0) & 1) | (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
           (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
           (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
           (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
           (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
           (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb
           | (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
           (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd | (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe
           | (uint)SUB321(auVar3 >> 0x7f,0) << 0xf | (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
           (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
           (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
           (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
           (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
           (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
           (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
           (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
           (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
           (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
           (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
           (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
           (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
           (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f)
          != 0xffffffff) {
        uVar9 = (uint)(SUB321(auVar4 >> 7,0) & 1) | (uint)(SUB321(auVar4 >> 0xf,0) & 1) << 1 |
                (uint)(SUB321(auVar4 >> 0x17,0) & 1) << 2 |
                (uint)(SUB321(auVar4 >> 0x1f,0) & 1) << 3 |
                (uint)(SUB321(auVar4 >> 0x27,0) & 1) << 4 |
                (uint)(SUB321(auVar4 >> 0x2f,0) & 1) << 5 |
                (uint)(SUB321(auVar4 >> 0x37,0) & 1) << 6 |
                (uint)(SUB321(auVar4 >> 0x3f,0) & 1) << 7 |
                (uint)(SUB321(auVar4 >> 0x47,0) & 1) << 8 |
                (uint)(SUB321(auVar4 >> 0x4f,0) & 1) << 9 |
                (uint)(SUB321(auVar4 >> 0x57,0) & 1) << 10 |
                (uint)(SUB321(auVar4 >> 0x5f,0) & 1) << 0xb |
                (uint)(SUB321(auVar4 >> 0x67,0) & 1) << 0xc |
                (uint)(SUB321(auVar4 >> 0x6f,0) & 1) << 0xd |
                (uint)(SUB321(auVar4 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar4 >> 0x7f,0) << 0xf
                | (uint)(SUB321(auVar4 >> 0x87,0) & 1) << 0x10 |
                (uint)(SUB321(auVar4 >> 0x8f,0) & 1) << 0x11 |
                (uint)(SUB321(auVar4 >> 0x97,0) & 1) << 0x12 |
                (uint)(SUB321(auVar4 >> 0x9f,0) & 1) << 0x13 |
                (uint)(SUB321(auVar4 >> 0xa7,0) & 1) << 0x14 |
                (uint)(SUB321(auVar4 >> 0xaf,0) & 1) << 0x15 |
                (uint)(SUB321(auVar4 >> 0xb7,0) & 1) << 0x16 |
                (uint)SUB321(auVar4 >> 0xbf,0) << 0x17 | (uint)(SUB321(auVar4 >> 199,0) & 1) << 0x18
                | (uint)(SUB321(auVar4 >> 0xcf,0) & 1) << 0x19 |
                (uint)(SUB321(auVar4 >> 0xd7,0) & 1) << 0x1a |
                (uint)(SUB321(auVar4 >> 0xdf,0) & 1) << 0x1b |
                (uint)(SUB321(auVar4 >> 0xe7,0) & 1) << 0x1c |
                (uint)(SUB321(auVar4 >> 0xef,0) & 1) << 0x1d |
                (uint)(SUB321(auVar4 >> 0xf7,0) & 1) << 0x1e |
                (uint)(byte)(auVar4[0x1f] >> 7) << 0x1f;
        if (uVar9 != 0xffffffff) {
          uVar8 = 0;
          for (uVar9 = ~uVar9; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x80000000) {
            uVar8 = uVar8 + 1;
          }
          return (char *)(paVar11 + (ulong)uVar8 + lVar13);
        }
        uVar9 = (uint)(SUB321(auVar5 >> 7,0) & 1) | (uint)(SUB321(auVar5 >> 0xf,0) & 1) << 1 |
                (uint)(SUB321(auVar5 >> 0x17,0) & 1) << 2 |
                (uint)(SUB321(auVar5 >> 0x1f,0) & 1) << 3 |
                (uint)(SUB321(auVar5 >> 0x27,0) & 1) << 4 |
                (uint)(SUB321(auVar5 >> 0x2f,0) & 1) << 5 |
                (uint)(SUB321(auVar5 >> 0x37,0) & 1) << 6 |
                (uint)(SUB321(auVar5 >> 0x3f,0) & 1) << 7 |
                (uint)(SUB321(auVar5 >> 0x47,0) & 1) << 8 |
                (uint)(SUB321(auVar5 >> 0x4f,0) & 1) << 9 |
                (uint)(SUB321(auVar5 >> 0x57,0) & 1) << 10 |
                (uint)(SUB321(auVar5 >> 0x5f,0) & 1) << 0xb |
                (uint)(SUB321(auVar5 >> 0x67,0) & 1) << 0xc |
                (uint)(SUB321(auVar5 >> 0x6f,0) & 1) << 0xd |
                (uint)(SUB321(auVar5 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar5 >> 0x7f,0) << 0xf
                | (uint)(SUB321(auVar5 >> 0x87,0) & 1) << 0x10 |
                (uint)(SUB321(auVar5 >> 0x8f,0) & 1) << 0x11 |
                (uint)(SUB321(auVar5 >> 0x97,0) & 1) << 0x12 |
                (uint)(SUB321(auVar5 >> 0x9f,0) & 1) << 0x13 |
                (uint)(SUB321(auVar5 >> 0xa7,0) & 1) << 0x14 |
                (uint)(SUB321(auVar5 >> 0xaf,0) & 1) << 0x15 |
                (uint)(SUB321(auVar5 >> 0xb7,0) & 1) << 0x16 |
                (uint)SUB321(auVar5 >> 0xbf,0) << 0x17 | (uint)(SUB321(auVar5 >> 199,0) & 1) << 0x18
                | (uint)(SUB321(auVar5 >> 0xcf,0) & 1) << 0x19 |
                (uint)(SUB321(auVar5 >> 0xd7,0) & 1) << 0x1a |
                (uint)(SUB321(auVar5 >> 0xdf,0) & 1) << 0x1b |
                (uint)(SUB321(auVar5 >> 0xe7,0) & 1) << 0x1c |
                (uint)(SUB321(auVar5 >> 0xef,0) & 1) << 0x1d |
                (uint)(SUB321(auVar5 >> 0xf7,0) & 1) << 0x1e |
                (uint)(byte)(auVar5[0x1f] >> 7) << 0x1f;
        if (uVar9 != 0xffffffff) {
          uVar8 = 0;
          for (uVar9 = ~uVar9; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x80000000) {
            uVar8 = uVar8 + 1;
          }
          return (char *)(paVar11 + lVar13 + (ulong)uVar8 + 0x20);
        }
        uVar9 = (uint)(SUB321(auVar6 >> 7,0) & 1) | (uint)(SUB321(auVar6 >> 0xf,0) & 1) << 1 |
                (uint)(SUB321(auVar6 >> 0x17,0) & 1) << 2 |
                (uint)(SUB321(auVar6 >> 0x1f,0) & 1) << 3 |
                (uint)(SUB321(auVar6 >> 0x27,0) & 1) << 4 |
                (uint)(SUB321(auVar6 >> 0x2f,0) & 1) << 5 |
                (uint)(SUB321(auVar6 >> 0x37,0) & 1) << 6 |
                (uint)(SUB321(auVar6 >> 0x3f,0) & 1) << 7 |
                (uint)(SUB321(auVar6 >> 0x47,0) & 1) << 8 |
                (uint)(SUB321(auVar6 >> 0x4f,0) & 1) << 9 |
                (uint)(SUB321(auVar6 >> 0x57,0) & 1) << 10 |
                (uint)(SUB321(auVar6 >> 0x5f,0) & 1) << 0xb |
                (uint)(SUB321(auVar6 >> 0x67,0) & 1) << 0xc |
                (uint)(SUB321(auVar6 >> 0x6f,0) & 1) << 0xd |
                (uint)(SUB321(auVar6 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar6 >> 0x7f,0) << 0xf
                | (uint)(SUB321(auVar6 >> 0x87,0) & 1) << 0x10 |
                (uint)(SUB321(auVar6 >> 0x8f,0) & 1) << 0x11 |
                (uint)(SUB321(auVar6 >> 0x97,0) & 1) << 0x12 |
                (uint)(SUB321(auVar6 >> 0x9f,0) & 1) << 0x13 |
                (uint)(SUB321(auVar6 >> 0xa7,0) & 1) << 0x14 |
                (uint)(SUB321(auVar6 >> 0xaf,0) & 1) << 0x15 |
                (uint)(SUB321(auVar6 >> 0xb7,0) & 1) << 0x16 |
                (uint)SUB321(auVar6 >> 0xbf,0) << 0x17 | (uint)(SUB321(auVar6 >> 199,0) & 1) << 0x18
                | (uint)(SUB321(auVar6 >> 0xcf,0) & 1) << 0x19 |
                (uint)(SUB321(auVar6 >> 0xd7,0) & 1) << 0x1a |
                (uint)(SUB321(auVar6 >> 0xdf,0) & 1) << 0x1b |
                (uint)(SUB321(auVar6 >> 0xe7,0) & 1) << 0x1c |
                (uint)(SUB321(auVar6 >> 0xef,0) & 1) << 0x1d |
                (uint)(SUB321(auVar6 >> 0xf7,0) & 1) << 0x1e |
                (uint)(byte)(auVar6[0x1f] >> 7) << 0x1f;
        if (uVar9 != 0xffffffff) {
          uVar8 = 0;
          for (uVar9 = ~uVar9; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x80000000) {
            uVar8 = uVar8 + 1;
          }
          return (char *)(paVar11 + lVar13 + (ulong)uVar8 + 0x40);
        }
        uVar9 = (uint)(SUB321(auVar7 >> 7,0) & 1) | (uint)(SUB321(auVar7 >> 0xf,0) & 1) << 1 |
                (uint)(SUB321(auVar7 >> 0x17,0) & 1) << 2 |
                (uint)(SUB321(auVar7 >> 0x1f,0) & 1) << 3 |
                (uint)(SUB321(auVar7 >> 0x27,0) & 1) << 4 |
                (uint)(SUB321(auVar7 >> 0x2f,0) & 1) << 5 |
                (uint)(SUB321(auVar7 >> 0x37,0) & 1) << 6 |
                (uint)(SUB321(auVar7 >> 0x3f,0) & 1) << 7 |
                (uint)(SUB321(auVar7 >> 0x47,0) & 1) << 8 |
                (uint)(SUB321(auVar7 >> 0x4f,0) & 1) << 9 |
                (uint)(SUB321(auVar7 >> 0x57,0) & 1) << 10 |
                (uint)(SUB321(auVar7 >> 0x5f,0) & 1) << 0xb |
                (uint)(SUB321(auVar7 >> 0x67,0) & 1) << 0xc |
                (uint)(SUB321(auVar7 >> 0x6f,0) & 1) << 0xd |
                (uint)(SUB321(auVar7 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar7 >> 0x7f,0) << 0xf
                | (uint)(SUB321(auVar7 >> 0x87,0) & 1) << 0x10 |
                (uint)(SUB321(auVar7 >> 0x8f,0) & 1) << 0x11 |
                (uint)(SUB321(auVar7 >> 0x97,0) & 1) << 0x12 |
                (uint)(SUB321(auVar7 >> 0x9f,0) & 1) << 0x13 |
                (uint)(SUB321(auVar7 >> 0xa7,0) & 1) << 0x14 |
                (uint)(SUB321(auVar7 >> 0xaf,0) & 1) << 0x15 |
                (uint)(SUB321(auVar7 >> 0xb7,0) & 1) << 0x16 |
                (uint)SUB321(auVar7 >> 0xbf,0) << 0x17 | (uint)(SUB321(auVar7 >> 199,0) & 1) << 0x18
                | (uint)(SUB321(auVar7 >> 0xcf,0) & 1) << 0x19 |
                (uint)(SUB321(auVar7 >> 0xd7,0) & 1) << 0x1a |
                (uint)(SUB321(auVar7 >> 0xdf,0) & 1) << 0x1b |
                (uint)(SUB321(auVar7 >> 0xe7,0) & 1) << 0x1c |
                (uint)(SUB321(auVar7 >> 0xef,0) & 1) << 0x1d |
                (uint)(SUB321(auVar7 >> 0xf7,0) & 1) << 0x1e |
                (uint)(byte)(auVar7[0x1f] >> 7) << 0x1f;
        if (uVar9 != 0xffffffff) {
          uVar8 = 0;
          for (uVar9 = ~uVar9; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x80000000) {
            uVar8 = uVar8 + 1;
          }
          return (char *)(paVar11 + lVar13 + (ulong)uVar8 + 0x60);
        }
        poVar12 = Error::defaultOutput();
        Error::Error(&local_30,poVar12,(Flags)0x0);
        Debug::operator<<(&local_30.super_Debug,
                          "Reached unreachable code at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:424"
                         );
        goto LAB_0013c2ce;
      }
    }
    for (; paVar1 = paVar11 + lVar13, paVar11 + lVar13 + 0x20 <= paVar15; lVar13 = lVar13 + 0x20) {
      auVar3 = vpcmpeqb_avx2(*(undefined1 (*) [32])paVar1,
                             *(undefined1 (*) [32])(a + lVar13 + lVar14));
      uVar9 = (uint)(SUB321(auVar3 >> 7,0) & 1) | (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
              (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3
              | (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 |
              (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 | (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6
              | (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
              (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9
              | (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 |
              (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb |
              (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
              (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd |
              (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
              (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
              (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
              (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
              (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
              (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
              (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
              (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar3 >> 0xbf,0) << 0x17
              | (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
              (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
              (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
              (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
              (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
              (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
              (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f
      ;
      if (uVar9 != 0xffffffff) {
        uVar8 = 0;
        for (uVar9 = ~uVar9; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x80000000) {
          uVar8 = uVar8 + 1;
        }
        return (char *)(paVar1 + uVar8);
      }
    }
    if (paVar15 <= paVar1) {
      return (char *)paVar15;
    }
    auVar3 = vpcmpeqb_avx2(*(undefined1 (*) [32])(paVar15 + -0x20),
                           *(undefined1 (*) [32])(a + -0x20 + (long)pcVar10));
    uVar9 = (uint)(SUB321(auVar3 >> 7,0) & 1) | (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
            (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
            (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
            (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
            (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
            (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb
            | (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
            (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd |
            (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
            (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
            (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
            (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
            (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
            (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
            (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
            (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
            (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
            (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
            (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
            (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
            (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
            (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
            (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f;
    if (uVar9 == 0xffffffff) {
      return (char *)paVar15;
    }
    this = paVar15 + -0x20;
  }
  uVar8 = 0;
  for (uVar9 = ~uVar9; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x80000000) {
    uVar8 = uVar8 + 1;
  }
  return (char *)(this + uVar8);
}

Assistant:

void ltrimInPlace(std::string& string, const Containers::ArrayView<const char> characters) {
    string.erase(0, string.find_first_not_of(characters, 0, characters.size()));
}